

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O1

QRect __thiscall QEvdevTouchScreenData::screenGeometry(QEvdevTouchScreenData *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  long lVar3;
  undefined8 uVar4;
  char cVar5;
  QWindow *context;
  QObject *context_00;
  Data *pDVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QRect QVar12;
  QRect QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QArrayData *local_70;
  storage_type_conflict *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_forceToActiveWindow == true) {
    context = (QWindow *)QGuiApplication::focusWindow();
    if (context == (QWindow *)0x0) {
LAB_0012b5b4:
      uVar8 = 0xffffffff00000000;
      uVar7 = 0;
      QVar12 = (QRect)(ZEXT816(0xffffffff) << 0x40);
      goto LAB_0012b5b8;
    }
    local_58 = QWindow::geometry();
    QVar12 = QHighDpi::toNativeWindowGeometry<QRect,QWindow>((QRect *)local_58,context);
  }
  else {
    context_00 = (QObject *)QGuiApplication::primaryScreen();
    if ((this->m_screenName).d.size != 0) {
      pDVar1 = (this->m_screen).wp.d;
      if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
         ((this->m_screen).wp.value == (QObject *)0x0)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QGuiApplication::screens();
        uVar4 = local_58._8_8_;
        if (local_48 != (undefined1 *)0x0) {
          lVar10 = (long)local_48 << 3;
          lVar9 = 0;
          do {
            pQVar2 = *(QObject **)(uVar4 + lVar9);
            QScreen::name();
            lVar3 = (this->m_screenName).d.size;
            if (local_60 == lVar3) {
              QVar14.m_data = local_68;
              QVar14.m_size = local_60;
              QVar15.m_data = (this->m_screenName).d.ptr;
              QVar15.m_size = lVar3;
              cVar5 = QtPrivate::equalStrings(QVar14,QVar15);
            }
            else {
              cVar5 = '\0';
            }
            if (local_70 != (QArrayData *)0x0) {
              LOCK();
              (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_70,2,0x10);
              }
            }
            if (cVar5 != '\0') {
              pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar2);
              pDVar1 = (this->m_screen).wp.d;
              (this->m_screen).wp.d = pDVar6;
              (this->m_screen).wp.value = pQVar2;
              if (pDVar1 != (Data *)0x0) {
                LOCK();
                *(int *)pDVar1 = *(int *)pDVar1 + -1;
                UNLOCK();
                if (*(int *)pDVar1 == 0) {
                  operator_delete(pDVar1);
                }
              }
              break;
            }
            lVar9 = lVar9 + 8;
          } while (lVar10 != lVar9);
        }
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
          }
        }
      }
      pDVar1 = (this->m_screen).wp.d;
      if (pDVar1 != (Data *)0x0) {
        bVar11 = (this->m_screen).wp.value != (QObject *)0x0;
        if (bVar11 && *(int *)(pDVar1 + 4) != 0) {
          context_00 = (QObject *)(QScreen *)0x0;
        }
        if (pDVar1 != (Data *)0x0 && (bVar11 && *(int *)(pDVar1 + 4) != 0)) {
          if (*(int *)(pDVar1 + 4) == 0) {
            context_00 = (QObject *)0x0;
          }
          else {
            context_00 = (this->m_screen).wp.value;
          }
        }
      }
    }
    if (context_00 == (QObject *)0x0) goto LAB_0012b5b4;
    local_58 = QScreen::geometry();
    QVar12 = QHighDpi::toNativePixels<QRect,QScreen>((QRect *)local_58,(QScreen *)context_00);
  }
  uVar7 = QVar12._0_8_ & 0xffffffff00000000;
  uVar8 = QVar12._8_8_ & 0xffffffff00000000;
LAB_0012b5b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar13._0_8_ = QVar12._0_8_ & 0xffffffff | uVar7;
  QVar13._8_8_ = QVar12._8_8_ & 0xffffffff | uVar8;
  return QVar13;
}

Assistant:

QRect QEvdevTouchScreenData::screenGeometry() const
{
    if (m_forceToActiveWindow) {
        QWindow *win = QGuiApplication::focusWindow();
        return win ? QHighDpi::toNativeWindowGeometry(win->geometry(), win) : QRect();
    }

    // Now it becomes tricky. Traditionally we picked the primaryScreen()
    // and were done with it. But then, enter multiple screens, and
    // suddenly it was all broken.
    //
    // For now we only support the display configuration of the KMS/DRM
    // backends of eglfs. See QOutputMapping.
    //
    // The good news it that once winRect refers to the correct screen
    // geometry in the full virtual desktop space, there is nothing else
    // left to do since qguiapp will handle the rest.
    QScreen *screen = QGuiApplication::primaryScreen();
    if (!m_screenName.isEmpty()) {
        if (!m_screen) {
            const QList<QScreen *> screens = QGuiApplication::screens();
            for (QScreen *s : screens) {
                if (s->name() == m_screenName) {
                    m_screen = s;
                    break;
                }
            }
        }
        if (m_screen)
            screen = m_screen;
    }
    return screen ? QHighDpi::toNativePixels(screen->geometry(), screen) : QRect();
}